

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O1

Position __thiscall indk::operator-(indk *this,Position *L,Position *R)

{
  uint _Xm;
  Error *this_00;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *extraout_RDX_01;
  float *pfVar1;
  ulong uVar2;
  float fVar3;
  Position PVar4;
  vector<float,_std::allocator<float>_> PV;
  float local_6c;
  vector<float,_std::allocator<float>_> local_68;
  vector<float,_std::allocator<float>_> local_48;
  
  if (L->DimensionsCount == R->DimensionsCount) {
    if (L->Xm == R->Xm) {
      local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (float *)0x0;
      local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (float *)0x0;
      if (L->DimensionsCount != 0) {
        uVar2 = 0;
        do {
          fVar3 = -1.0;
          if (uVar2 < R->DimensionsCount) {
            fVar3 = R->X[uVar2];
          }
          local_6c = ABS(L->X[uVar2] - fVar3);
          if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_68,
                       (iterator)
                       local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_6c);
          }
          else {
            *local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = local_6c;
            local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 < L->DimensionsCount);
      }
      _Xm = L->Xm;
      std::vector<float,_std::allocator<float>_>::vector(&local_48,&local_68);
      Position::Position((Position *)this,_Xm,&local_48);
      pfVar1 = extraout_RDX;
      if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
        pfVar1 = extraout_RDX_00;
      }
      if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
        pfVar1 = extraout_RDX_01;
      }
      PVar4.X = pfVar1;
      PVar4._0_8_ = this;
      return PVar4;
    }
    this_00 = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(this_00,9);
  }
  else {
    this_00 = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(this_00,10);
  }
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

unsigned int indk::Position::getDimensionsCount() const {
    return DimensionsCount;
}